

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v8::basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::get_id<char>
          (basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *this,
          basic_string_view<char> name)

{
  basic_string_view<char> rhs;
  basic_string_view<char> lhs;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *in_RDI;
  size_t i;
  named_arg_value<char> *named_args;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_70;
  char *__s;
  ulong local_40;
  
  bVar1 = has_named_args(in_RDI);
  if (bVar1) {
    bVar1 = is_packed(in_RDI);
    if (bVar1) {
      local_70 = (in_RDI->field_1).values_ + -1;
    }
    else {
      local_70 = (in_RDI->field_1).values_ + -2;
    }
    for (local_40 = 0; local_40 < (local_70->field_0).string.size; local_40 = local_40 + 1) {
      __s = *(char **)((long)(local_70->field_0).pointer + local_40 * 0x10);
      strlen(__s);
      lhs.size_ = (size_t)__s;
      lhs.data_ = in_RDX;
      rhs.size_ = in_RSI;
      rhs.data_ = (char *)in_RDI;
      bVar1 = v8::operator==(lhs,rhs);
      if (bVar1) {
        return *(int *)((long)(local_70->field_0).pointer + local_40 * 0x10 + 8);
      }
    }
  }
  return -1;
}

Assistant:

auto get_id(basic_string_view<Char> name) const -> int {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }